

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamFtp::ConnectCommandSocket(BamFtp *this)

{
  bool bVar1;
  string typeCommand;
  string passwordCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string userCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = TcpSocket::ConnectToHost
                    (this->m_commandSocket,&this->m_hostname,this->m_port,
                     (this->super_IBamIODevice).m_mode);
  if (bVar1) {
    bVar1 = ReceiveReply(this);
    if (bVar1) {
      std::operator+(&typeCommand,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     USER_CMD_abi_cxx11_,' ');
      std::operator+(&passwordCommand,&typeCommand,&this->m_username);
      std::operator+(&userCommand,&passwordCommand,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FTP_NEWLINE_abi_cxx11_);
      std::__cxx11::string::~string((string *)&passwordCommand);
      std::__cxx11::string::~string((string *)&typeCommand);
      bVar1 = SendCommand(this,&userCommand,true);
      if (bVar1) {
        std::operator+(&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       PASS_CMD_abi_cxx11_,' ');
        std::operator+(&typeCommand,&local_78,&this->m_password);
        std::operator+(&passwordCommand,&typeCommand,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FTP_NEWLINE_abi_cxx11_);
        std::__cxx11::string::~string((string *)&typeCommand);
        std::__cxx11::string::~string((string *)&local_78);
        bVar1 = SendCommand(this,&passwordCommand,true);
        if (bVar1) {
          std::operator+(&local_38,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         TYPE_CMD_abi_cxx11_,' ');
          std::operator+(&local_78,&local_38,'I');
          std::operator+(&typeCommand,&local_78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         FTP_NEWLINE_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_38);
          bVar1 = SendCommand(this,&typeCommand,true);
          if (!bVar1) {
            (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
          }
          std::__cxx11::string::~string((string *)&typeCommand);
        }
        else {
          (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)&passwordCommand);
      }
      else {
        (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&userCommand);
      return bVar1;
    }
    (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
  }
  else {
    std::__cxx11::string::string
              ((string *)&userCommand,"BamFtp::ConnectCommandSocket",(allocator *)&typeCommand);
    std::__cxx11::string::string
              ((string *)&passwordCommand,"could not connect to host - ",(allocator *)&local_78);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&userCommand,&passwordCommand);
    std::__cxx11::string::~string((string *)&passwordCommand);
    std::__cxx11::string::~string((string *)&userCommand);
  }
  return false;
}

Assistant:

bool BamFtp::ConnectCommandSocket()
{

    BT_ASSERT_X(m_commandSocket, "null command socket?");

    // connect to FTP server
    if (!m_commandSocket->ConnectToHost(m_hostname, m_port, m_mode)) {
        SetErrorString("BamFtp::ConnectCommandSocket", "could not connect to host - ");
        return false;
    }

    // receive initial reply from host
    if (!ReceiveReply()) {
        Close();
        return false;
    }

    // send USER command
    std::string userCommand = USER_CMD + CMD_SEPARATOR + m_username + FTP_NEWLINE;
    if (!SendCommand(userCommand, true)) {
        Close();
        return false;
    }

    // send PASS command
    std::string passwordCommand = PASS_CMD + CMD_SEPARATOR + m_password + FTP_NEWLINE;
    if (!SendCommand(passwordCommand, true)) {
        Close();
        return false;
    }

    // send TYPE command
    std::string typeCommand = TYPE_CMD + CMD_SEPARATOR + 'I' + FTP_NEWLINE;
    if (!SendCommand(typeCommand, true)) {
        Close();
        return false;
    }

    // return success
    return true;
}